

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ev_dfg.c
# Opt level: O0

int new_shutdown_condition(EVclient client,CMConnection conn)

{
  int iVar1;
  transport_entry_conflict p_Var2;
  void *in_RSI;
  CMConnection in_RDI;
  int cur_count;
  CManager unaff_retaddr;
  undefined4 in_stack_ffffffffffffffe8;
  int iVar3;
  
  iVar3 = 0;
  iVar1 = iVar3;
  if (in_RDI->trans == (transport_entry_conflict)0x0) {
    p_Var2 = (transport_entry_conflict)INT_CMmalloc((size_t)in_RSI);
    in_RDI->trans = p_Var2;
  }
  else {
    do {
      iVar3 = iVar1;
      iVar1 = iVar3 + 1;
    } while (*(int *)((long)&in_RDI->trans->trans_name + (long)iVar3 * 4) != -1);
    p_Var2 = (transport_entry_conflict)
             INT_CMrealloc(in_RSI,CONCAT44(iVar3,in_stack_ffffffffffffffe8));
    in_RDI->trans = p_Var2;
  }
  iVar1 = INT_CMCondition_get(unaff_retaddr,in_RDI);
  *(int *)((long)&in_RDI->trans->trans_name + (long)iVar3 * 4) = iVar1;
  *(undefined4 *)((long)&in_RDI->trans->trans_name + (long)(iVar3 + 1) * 4) = 0xffffffff;
  return *(int *)((long)&in_RDI->trans->trans_name + (long)iVar3 * 4);
}

Assistant:

static int
new_shutdown_condition(EVclient client, CMConnection conn)
{
    int cur_count = 0;
    if (client->shutdown_conditions == NULL) {
	client->shutdown_conditions = malloc(2*sizeof(client->shutdown_conditions[0]));
    } else {
	while (client->shutdown_conditions[cur_count++] != -1) ; 
	cur_count--;
	client->shutdown_conditions = realloc(client->shutdown_conditions, 
					   (cur_count+2)*sizeof(client->shutdown_conditions[0]));
    }
    client->shutdown_conditions[cur_count] = INT_CMCondition_get(client->cm, conn);
    client->shutdown_conditions[cur_count+1] = -1;
    return client->shutdown_conditions[cur_count];
}